

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::rehash
          (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *this,size_t sizeHint)

{
  uchar *puVar1;
  ulong uVar2;
  Span *pSVar3;
  Entry *pEVar4;
  Data *pDVar5;
  char *pcVar6;
  qsizetype qVar7;
  Node<QByteArray,_QByteArray> *pNVar8;
  ulong uVar9;
  size_t index;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  R RVar14;
  Bucket BVar15;
  QByteArrayView QVar16;
  Span *local_48;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  sVar11 = 0x80;
  if ((0x40 < sizeHint) && (sVar11 = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar10 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    sVar11 = 1L << (0x41 - ((byte)lVar10 ^ 0x3f) & 0x3f);
  }
  uVar2 = this->numBuckets;
  pSVar3 = this->spans;
  RVar14 = allocateSpans(sVar11);
  this->spans = (Span *)RVar14.spans;
  this->numBuckets = sVar11;
  if (0x7f < uVar2) {
    uVar9 = 0;
    local_48 = pSVar3;
    do {
      lVar10 = 0;
      do {
        if (local_48->offsets[lVar10] != 0xff) {
          pEVar4 = pSVar3[uVar9].entries;
          uVar12 = (ulong)((uint)local_48->offsets[lVar10] * 0x30);
          QVar16.m_data = *(storage_type **)((pEVar4->storage).data + uVar12 + 8);
          QVar16.m_size = *(qsizetype *)((pEVar4->storage).data + uVar12 + 0x10);
          sVar11 = qHash(QVar16,this->seed);
          BVar15 = findBucketWithHash<QByteArray>
                             (this,(QByteArray *)((pEVar4->storage).data + uVar12),sVar11);
          pNVar8 = Span<QHashPrivate::Node<QByteArray,_QByteArray>_>::insert
                             (BVar15.span,BVar15.index);
          pDVar5 = *(Data **)((pEVar4->storage).data + uVar12);
          puVar1 = (pEVar4->storage).data + uVar12;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar8->key).d.d = pDVar5;
          pcVar6 = *(char **)((pEVar4->storage).data + uVar12 + 8);
          puVar1 = (pEVar4->storage).data + uVar12 + 8;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar8->key).d.ptr = pcVar6;
          qVar7 = *(qsizetype *)((pEVar4->storage).data + uVar12 + 0x10);
          puVar1 = (pEVar4->storage).data + uVar12 + 0x10;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar8->key).d.size = qVar7;
          pDVar5 = *(Data **)((pEVar4->storage).data + uVar12 + 0x18);
          puVar1 = (pEVar4->storage).data + uVar12 + 0x18;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar8->value).d.d = pDVar5;
          pcVar6 = *(char **)((pEVar4->storage).data + uVar12 + 0x20);
          puVar1 = (pEVar4->storage).data + uVar12 + 0x20;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar8->value).d.ptr = pcVar6;
          qVar7 = *(qsizetype *)((pEVar4->storage).data + uVar12 + 0x28);
          puVar1 = (pEVar4->storage).data + uVar12 + 0x28;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          (pNVar8->value).d.size = qVar7;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x80);
      Span<QHashPrivate::Node<QByteArray,_QByteArray>_>::freeData(pSVar3 + uVar9);
      uVar9 = uVar9 + 1;
      local_48 = local_48 + 1;
    } while (uVar9 != uVar2 >> 7);
  }
  if (pSVar3 != (Span *)0x0) {
    lVar10 = *(long *)&pSVar3[-1].allocated;
    if (lVar10 != 0) {
      lVar13 = lVar10 * 0x90;
      do {
        Span<QHashPrivate::Node<QByteArray,_QByteArray>_>::freeData
                  ((Span<QHashPrivate::Node<QByteArray,_QByteArray>_> *)
                   (pSVar3[-1].offsets + lVar13));
        lVar13 = lVar13 + -0x90;
      } while (lVar13 != 0);
    }
    operator_delete__(&pSVar3[-1].allocated,lVar10 * 0x90 + 8);
    return;
  }
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }